

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc.cc
# Opt level: O2

void __thiscall
tchecker::system::locs_t::add_location
          (locs_t *this,process_id_t pid,string *name,attributes_t *attributes)

{
  pointer psVar1;
  bool bVar2;
  loc_t *this_00;
  runtime_error *this_01;
  pointer piVar3;
  ulong uVar4;
  pointer pvVar5;
  loc_id_t id;
  range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
  rVar6;
  allocator<char> local_61;
  loc_shared_ptr_t loc;
  string local_50;
  
  id = (loc_id_t)
       ((ulong)((long)(this->_locs).
                      super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_locs).
                     super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
  bVar2 = valid_loc_id(id);
  if (!bVar2) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"add_location: invalid location identifier");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (loc_t *)operator_new(0x60);
  loc_t::loc_t(this_00,pid,id,name,attributes);
  std::__shared_ptr<tchecker::system::loc_t,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::system::loc_t,void>
            ((__shared_ptr<tchecker::system::loc_t,(__gnu_cxx::_Lock_policy)2> *)&loc,this_00);
  uVar4 = (ulong)pid;
  piVar3 = (this->_locs_index).
           super__Vector_base<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>,_std::allocator<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->_locs_index).
                     super__Vector_base<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>,_std::allocator<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)piVar3) / 0x30) <= uVar4) {
    std::
    vector<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>,_std::allocator<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>_>_>
    ::resize(&this->_locs_index,(ulong)(pid + 1));
    piVar3 = (this->_locs_index).
             super__Vector_base<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>,_std::allocator<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>
  ::add(piVar3 + uVar4,name,&loc);
  pvVar5 = (this->_process_locs).
           super__Vector_base<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->_process_locs).
                     super__Vector_base<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5) / 0x18) <= uVar4) {
    std::
    vector<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
    ::resize(&this->_process_locs,(ulong)(pid + 1));
    pvVar5 = (this->_process_locs).
             super__Vector_base<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  std::
  vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
  ::push_back(pvVar5 + uVar4,&loc);
  std::
  vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
  ::push_back(&this->_locs,&loc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"initial",&local_61);
  rVar6 = attributes_t::range(attributes,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if ((const_iterator)
      rVar6._begin.super_const_iterator.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
      ._M_cur !=
      (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
       )rVar6._end.super_const_iterator.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
        ._M_cur) {
    pvVar5 = (this->_initial_locs).
             super__Vector_base<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_initial_locs).
                       super__Vector_base<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5) / 0x18) <= uVar4)
    {
      std::
      vector<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
      ::resize(&this->_initial_locs,(ulong)(pid + 1));
      pvVar5 = (this->_initial_locs).
               super__Vector_base<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    std::
    vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
    ::push_back(pvVar5 + uVar4,&loc);
  }
  psVar1 = (this->_locs).
           super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((long)psVar1 -
       (long)(this->_locs).
             super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U ==
      (ulong)(psVar1[-1].super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_id) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&loc.super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return;
  }
  __assert_fail("_locs.back()->id() == _locs.size() - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/system/loc.cc"
                ,0x5c,
                "void tchecker::system::locs_t::add_location(tchecker::process_id_t, const std::string &, const tchecker::system::attributes_t &)"
               );
}

Assistant:

void locs_t::add_location(tchecker::process_id_t pid, std::string const & name,
                          tchecker::system::attributes_t const & attributes)
{
  tchecker::loc_id_t id = _locs.size();

  if (!tchecker::valid_loc_id(id))
    throw std::runtime_error("add_location: invalid location identifier");

  tchecker::system::loc_shared_ptr_t loc(new tchecker::system::loc_t(pid, id, name, attributes));

  if (pid >= _locs_index.size())
    _locs_index.resize(pid + 1);
  _locs_index[pid].add(name, loc); // may throw

  if (pid >= _process_locs.size())
    _process_locs.resize(pid + 1);
  _process_locs[pid].push_back(loc);

  _locs.push_back(loc);

  auto range = attributes.range("initial");
  if (range.begin() != range.end()) {
    if (pid >= _initial_locs.size())
      _initial_locs.resize(pid + 1);
    _initial_locs[pid].push_back(loc);
  }

  assert(_locs.back()->id() == _locs.size() - 1);
}